

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtHashedSimplePairCache.cpp
# Opt level: O2

cbtSimplePair * __thiscall
cbtHashedSimplePairCache::internalAddPair(cbtHashedSimplePairCache *this,int indexA,int indexB)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  cbtSimplePair *pcVar5;
  
  uVar4 = getHash(this,indexA,indexB);
  uVar4 = (this->m_overlappingPairArray).m_capacity - 1U & uVar4;
  pcVar5 = internalFindPair(this,indexA,indexB,uVar4);
  if (pcVar5 == (cbtSimplePair *)0x0) {
    iVar1 = (this->m_overlappingPairArray).m_size;
    iVar2 = (this->m_overlappingPairArray).m_capacity;
    pcVar5 = cbtAlignedObjectArray<cbtSimplePair>::expandNonInitializing
                       (&this->m_overlappingPairArray);
    if (iVar2 < (this->m_overlappingPairArray).m_capacity) {
      growTables(this);
      uVar4 = getHash(this,indexA,indexB);
      uVar4 = (this->m_overlappingPairArray).m_capacity - 1U & uVar4;
    }
    pcVar5->m_indexA = indexA;
    pcVar5->m_indexB = indexB;
    (pcVar5->field_2).m_userPointer = (void *)0x0;
    piVar3 = (this->m_hashTable).m_data;
    (this->m_next).m_data[iVar1] = piVar3[(int)uVar4];
    piVar3[(int)uVar4] = iVar1;
  }
  return pcVar5;
}

Assistant:

cbtSimplePair* cbtHashedSimplePairCache::internalAddPair(int indexA, int indexB)
{
	int hash = static_cast<int>(getHash(static_cast<unsigned int>(indexA), static_cast<unsigned int>(indexB)) & (m_overlappingPairArray.capacity() - 1));  // New hash value with new mask

	cbtSimplePair* pair = internalFindPair(indexA, indexB, hash);
	if (pair != NULL)
	{
		return pair;
	}

	int count = m_overlappingPairArray.size();
	int oldCapacity = m_overlappingPairArray.capacity();
	void* mem = &m_overlappingPairArray.expandNonInitializing();

	int newCapacity = m_overlappingPairArray.capacity();

	if (oldCapacity < newCapacity)
	{
		growTables();
		//hash with new capacity
		hash = static_cast<int>(getHash(static_cast<unsigned int>(indexA), static_cast<unsigned int>(indexB)) & (m_overlappingPairArray.capacity() - 1));
	}

	pair = new (mem) cbtSimplePair(indexA, indexB);

	pair->m_userPointer = 0;

	m_next[count] = m_hashTable[hash];
	m_hashTable[hash] = count;

	return pair;
}